

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O3

void __thiscall
ValidateVulnerability::ReadFirstVulnerabilityLine
          (ValidateVulnerability *this,OASIS_FLOAT *totalProbability)

{
  Validate *this_00;
  int *__v;
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  const_iterator __position;
  long lVar8;
  _Alloc_node __an;
  
  this_00 = &this->super_Validate;
  pcVar5 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar5 != (char *)0x0) {
    __v = &(this->v_).intensity_bin_id;
    iVar3 = __isoc99_sscanf(this_00,"%lld,%d,%d,%f",&this->initialVulID_,__v,
                            &(this->v_).damage_bin_id,&(this->v_).probability);
    if (iVar3 == 4) {
      uVar4 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,this->vulIDName_,this->initialVulID_);
      (this->v_).vulnerability_id = uVar4;
      if ((int)uVar4 < this->prevVulID_) {
        uVar2 = (this->super_Validate).lineno_;
        fprintf(_stderr,
                "ERROR: Vulnerability IDs %d and %d in lines %d and %d respectively are not in ascending order:\n%s\n%s\n"
                ,(ulong)(uint)this->prevVulID_,(ulong)uVar4,(ulong)(uVar2 - 1),(ulong)uVar2,this_00,
                this->prevLine_);
        Validate::PrintErrorMessage(this_00);
        uVar4 = (this->v_).vulnerability_id;
      }
      piVar1 = &(this->super_Validate).lineno_;
      *piVar1 = *piVar1 + 1;
      this->prevVulID_ = uVar4;
      iVar3 = (this->v_).damage_bin_id;
      this->prevIntBinID_ = (this->v_).intensity_bin_id;
      this->prevDamageBinID_ = iVar3;
      if (this->maxDamageBin_ < iVar3) {
        this->maxDamageBin_ = iVar3;
      }
      sVar6 = strlen(this_00->line_);
      memcpy(this->prevLine_,this_00,sVar6 + 1);
      sVar6 = strlen(this_00->line_);
      this->prevLine_[sVar6 - 1] = '\0';
      this->maxDamageBin_ = (this->v_).damage_bin_id;
      *totalProbability = (this->v_).probability;
      if (this->allIntensityBinsCheck_ != true) {
        return;
      }
      pmVar7 = std::
               map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](&this->vulIDToIntBinIDs_,&(this->v_).vulnerability_id);
      __an._M_t = &std::
                   map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   ::operator[](&this->vulIDToIntBinIDs_,&(this->v_).vulnerability_id)->_M_t;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 __an._M_t,(const_iterator)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header,__v,&__an);
      iVar3 = (this->v_).intensity_bin_id;
      lVar8 = (long)iVar3;
      if ((int)(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_node_count < iVar3) {
        __position._M_node = &(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        __position._M_node =
             (this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (iVar3 < 1) {
          if (iVar3 != 0) {
            do {
              __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0);
          }
        }
        else {
          do {
            __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
      __an._M_t = &(this->intensityBinIDs_)._M_t;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 __an._M_t,__position,__v,&__an);
      return;
    }
    ReadFirstVulnerabilityLine();
  }
  ReadFirstVulnerabilityLine((ValidateVulnerability *)this_00);
  return;
}

Assistant:

void ValidateVulnerability::ReadFirstVulnerabilityLine(OASIS_FLOAT &totalProbability) {

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();
      StoreLine();
      maxDamageBin_ = v_.damage_bin_id;   // Set initial value
      totalProbability = v_.probability;
      if (allIntensityBinsCheck_) SetIntensityBinIDs();

      return;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}